

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O2

int __thiscall NetOptimize::fuse_convolutiondepthwise_activation(NetOptimize *this)

{
  string *__lhs;
  int iVar1;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar2;
  Layer *pLVar3;
  int *piVar4;
  pointer ppLVar5;
  Layer *pLVar6;
  undefined4 *puVar7;
  bool bVar8;
  ulong uVar9;
  Mat *pMVar10;
  ulong uVar11;
  ulong uVar12;
  ulong local_80;
  Mat local_78;
  
  pvVar2 = (this->super_ModelWriter).layers;
  uVar12 = (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar2->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3;
  local_80 = 1;
  uVar11 = 0;
  do {
    if (uVar11 == uVar12) {
      return 0;
    }
    bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar11]->type,
                            "ConvolutionDepthWise");
    if (!bVar8) {
      iVar1 = *((((this->super_ModelWriter).layers)->
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar11]->tops).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (uVar9 = local_80; uVar9 < uVar12; uVar9 = uVar9 + 1) {
        bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar9]->type,"ReLU");
        if (((((!bVar8) ||
              (bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar9]->type,
                                       "Clip"), !bVar8)) ||
             (bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar9]->type,
                                      "Sigmoid"), !bVar8)) ||
            ((bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar9]->type,
                                      "Mish"), !bVar8 ||
             (bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar9]->type,
                                      "HardSwish"), !bVar8)))) &&
           ((pLVar3 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar9],
            piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)*(pointer *)
                   ((long)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                   8) - (long)piVar4 == 4 && (*piVar4 == iVar1)))) {
          if (uVar12 != uVar9) {
            ppLVar5 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar3 = ppLVar5[uVar11];
            pLVar6 = ppLVar5[uVar9];
            fprintf(_stderr,"fuse_convolutiondepthwise_activation %s %s\n",
                    (pLVar3->name)._M_dataplus._M_p);
            __lhs = &pLVar6->type;
            bVar8 = std::operator==(__lhs,"ReLU");
            if (bVar8) {
              if ((*(float *)&pLVar6[1]._vptr_Layer != 0.0) ||
                 (NAN(*(float *)&pLVar6[1]._vptr_Layer))) {
                *(undefined4 *)&pLVar3[1].type.field_2 = 2;
                ncnn::Mat::Mat(&local_78,1,4,(Allocator *)0x0);
                pMVar10 = (Mat *)((long)&pLVar3[1].type.field_2 + 8);
                ncnn::Mat::operator=(pMVar10,&local_78);
                ncnn::Mat::~Mat(&local_78);
                *(undefined4 *)pMVar10->data = *(undefined4 *)&pLVar6[1]._vptr_Layer;
              }
              else {
                *(undefined4 *)&pLVar3[1].type.field_2 = 1;
              }
            }
            else {
              bVar8 = std::operator==(__lhs,"Clip");
              if (bVar8) {
                *(undefined4 *)&pLVar3[1].type.field_2 = 3;
                ncnn::Mat::Mat(&local_78,2,4,(Allocator *)0x0);
                pMVar10 = (Mat *)((long)&pLVar3[1].type.field_2 + 8);
                ncnn::Mat::operator=(pMVar10,&local_78);
                ncnn::Mat::~Mat(&local_78);
                puVar7 = (undefined4 *)pMVar10->data;
                *puVar7 = *(undefined4 *)&pLVar6[1]._vptr_Layer;
                puVar7[1] = *(undefined4 *)((long)&pLVar6[1]._vptr_Layer + 4);
              }
              else {
                bVar8 = std::operator==(__lhs,"Sigmoid");
                if (bVar8) {
                  *(undefined4 *)&pLVar3[1].type.field_2 = 4;
                }
                else {
                  bVar8 = std::operator==(__lhs,"Mish");
                  if (bVar8) {
                    *(undefined4 *)&pLVar3[1].type.field_2 = 5;
                  }
                  else {
                    bVar8 = std::operator==(__lhs,"HardSwish");
                    if (bVar8) {
                      *(undefined4 *)&pLVar3[1].type.field_2 = 6;
                      ncnn::Mat::Mat(&local_78,2,4,(Allocator *)0x0);
                      pMVar10 = (Mat *)((long)&pLVar3[1].type.field_2 + 8);
                      ncnn::Mat::operator=(pMVar10,&local_78);
                      ncnn::Mat::~Mat(&local_78);
                      puVar7 = (undefined4 *)pMVar10->data;
                      *puVar7 = *(undefined4 *)&pLVar6[1]._vptr_Layer;
                      puVar7[1] = *(undefined4 *)((long)&pLVar6[1]._vptr_Layer + 4);
                    }
                  }
                }
              }
            }
            iVar1 = *(pLVar6->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            *(pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar1;
            (((this->super_ModelWriter).blobs)->
            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
            super__Vector_impl_data._M_start[iVar1].producer = (int)uVar11;
            std::__cxx11::string::assign((char *)__lhs);
          }
          break;
        }
      }
    }
    uVar11 = uVar11 + 1;
    local_80 = local_80 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_convolutiondepthwise_activation()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "ConvolutionDepthWise")
            continue;

        // ConvolutionDepthWise - Activation
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "ReLU" && layers[j]->type != "Clip" && layers[j]->type != "Sigmoid" && layers[j]->type != "Mish" && layers[j]->type != "HardSwish")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse ConvolutionDepthWise - Activation to ConvolutionDepthWise
        ncnn::ConvolutionDepthWise* convolutiondepthwise = (ncnn::ConvolutionDepthWise*)layers[i];
        ncnn::Layer* activation = layers[j];

        fprintf(stderr, "fuse_convolutiondepthwise_activation %s %s\n", convolutiondepthwise->name.c_str(), activation->name.c_str());

        if (activation->type == "ReLU")
        {
            ncnn::ReLU* relu = (ncnn::ReLU*)activation;

            if (relu->slope == 0.f)
            {
                convolutiondepthwise->activation_type = 1;
            }
            else
            {
                convolutiondepthwise->activation_type = 2;
                convolutiondepthwise->activation_params = ncnn::Mat(1);
                convolutiondepthwise->activation_params[0] = relu->slope;
            }
        }
        else if (activation->type == "Clip")
        {
            ncnn::Clip* clip = (ncnn::Clip*)activation;

            convolutiondepthwise->activation_type = 3;
            convolutiondepthwise->activation_params = ncnn::Mat(2);
            convolutiondepthwise->activation_params[0] = clip->min;
            convolutiondepthwise->activation_params[1] = clip->max;
        }
        else if (activation->type == "Sigmoid")
        {
            convolutiondepthwise->activation_type = 4;
        }
        else if (activation->type == "Mish")
        {
            convolutiondepthwise->activation_type = 5;
        }
        else if (activation->type == "HardSwish")
        {
            ncnn::HardSwish* hardswish = (ncnn::HardSwish*)activation;

            convolutiondepthwise->activation_type = 6;
            convolutiondepthwise->activation_params = ncnn::Mat(2);
            convolutiondepthwise->activation_params[0] = hardswish->alpha;
            convolutiondepthwise->activation_params[1] = hardswish->beta;
        }

        int top_blob_index_final = activation->tops[0];
        convolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        activation->type = "ncnnfused";
    }

    return 0;
}